

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellBST::AddLayer
          (ChElementShellBST *this,double thickness,double theta,
          shared_ptr<chrono::fea::ChMaterialShellKirchhoff> *material)

{
  __shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2> local_48;
  Layer local_38;
  
  std::__shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &material->
              super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>)
  ;
  Layer::Layer(&local_38,this,thickness,theta,
               (shared_ptr<chrono::fea::ChMaterialShellKirchhoff> *)&local_48);
  std::
  vector<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
  ::emplace_back<chrono::fea::ChElementShellBST::Layer>(&this->m_layers,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.m_material.
              super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  SetLayerZreferenceCentered(this);
  return;
}

Assistant:

void ChElementShellBST::AddLayer(double thickness,
                                       double theta,
                                       std::shared_ptr<ChMaterialShellKirchhoff> material) {
    m_layers.push_back(Layer(this, thickness, theta, material));
    SetLayerZreferenceCentered();
}